

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uciengine.cpp
# Opt level: O0

string * __thiscall
banksia::UciEngine::getPositionString_abi_cxx11_(UciEngine *this,Move *pondermove)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  Hist *hist;
  iterator __end2;
  iterator __begin2;
  vector<banksia::Hist,_std::allocator<banksia::Hist>_> *__range2;
  string *str;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string *this_00;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [8];
  Move *in_stack_ffffffffffffff28;
  string local_c0 [32];
  reference local_a0;
  Hist *local_98;
  __normal_iterator<banksia::Hist_*,_std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>_>
  local_90;
  long local_88;
  byte local_79;
  string local_78 [54];
  byte local_42;
  undefined1 local_41 [40];
  undefined1 local_19;
  
  local_19 = 0;
  this_00 = in_RDI;
  bVar1 = BoardCore::fromOriginPosition((BoardCore *)0x1afced);
  local_42 = 0;
  local_79 = 0;
  if (bVar1) {
    in_stack_fffffffffffffec0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string
              ((string *)(local_41 + 1),"startpos",(allocator *)in_stack_fffffffffffffec0);
  }
  else {
    BoardCore::getStartingFen_abi_cxx11_
              ((BoardCore *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    local_79 = 1;
    std::operator+((char *)in_RDI,in_stack_fffffffffffffec0);
  }
  std::operator+((char *)in_RDI,in_stack_fffffffffffffec0);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  if ((local_79 & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_41);
  }
  bVar1 = std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>::empty
                    ((vector<banksia::Hist,_std::allocator<banksia::Hist>_> *)this_00);
  if (!bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI," moves");
    local_88 = *(long *)(in_RSI + 200) + 0x28;
    local_90._M_current =
         (Hist *)std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>::begin
                           ((vector<banksia::Hist,_std::allocator<banksia::Hist>_> *)
                            CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    local_98 = (Hist *)std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>::end
                                 ((vector<banksia::Hist,_std::allocator<banksia::Hist>_> *)
                                  CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<banksia::Hist_*,_std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>_>
                               *)in_stack_fffffffffffffec0,
                              (__normal_iterator<banksia::Hist_*,_std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>_>
                               *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)),
          bVar1) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<banksia::Hist_*,_std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>_>
                 ::operator*(&local_90);
      Move::toCoordinateString_abi_cxx11_(in_stack_ffffffffffffff28);
      std::operator+((char *)in_RDI,in_stack_fffffffffffffec0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
      __gnu_cxx::
      __normal_iterator<banksia::Hist_*,_std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>_>
      ::operator++(&local_90);
    }
  }
  bVar1 = Move::isValid((Move *)0x1affdc);
  if (bVar1) {
    bVar1 = std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>::empty
                      ((vector<banksia::Hist,_std::allocator<banksia::Hist>_> *)this_00);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)in_RDI," moves");
    }
    Move::toCoordinateString_abi_cxx11_(in_stack_ffffffffffffff28);
    std::operator+((char *)in_RDI,in_stack_fffffffffffffec0);
    std::__cxx11::string::operator+=((string *)in_RDI,local_100);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
  }
  return this_00;
}

Assistant:

std::string UciEngine::getPositionString(const Move& pondermove) const
{
    assert(board);
    
    std::string str = "position " + (board->fromOriginPosition() ? "startpos" : ("fen " + board->getStartingFen()));
    
    if (!board->histList.empty()) {
        str += " moves";
        for(auto && hist : board->histList) {
            str += " " + hist.move.toCoordinateString();
        }
    }
    
    if (pondermove.isValid()) {
        if (board->histList.empty()) {
            str += " moves";
        }
        str += " " + pondermove.toCoordinateString();
    }
    return str;
}